

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<std::pair<double,unsigned_long>>
          (Serializer *this,
          priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
          *queue)

{
  vector<std::pair<double,_unsigned_long>,_true> placeholder;
  priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
  queue_copy;
  _Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  local_58;
  priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
  local_38;
  
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::
  vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>::
  vector(&local_38.c,&queue->c);
  while (local_38.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_finish !=
         local_38.c.
         super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
         ._M_impl.super__Vector_impl_data._M_start) {
    ::std::vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>::
    emplace_back<std::pair<double,unsigned_long>const&>
              ((vector<std::pair<double,unsigned_long>,std::allocator<std::pair<double,unsigned_long>>>
                *)&local_58,
               local_38.c.
               super__Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    ::std::
    priority_queue<std::pair<double,_unsigned_long>,_std::vector<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>,_std::less<std::pair<double,_unsigned_long>_>_>
    ::pop(&local_38);
  }
  WriteValue<std::pair<double,unsigned_long>>
            (this,(vector<std::pair<double,_unsigned_long>,_true> *)&local_58);
  ::std::
  _Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ::~_Vector_base((_Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
                   *)&local_38);
  ::std::
  _Vector_base<std::pair<double,_unsigned_long>,_std::allocator<std::pair<double,_unsigned_long>_>_>
  ::~_Vector_base(&local_58);
  return;
}

Assistant:

void WriteValue(const std::priority_queue<T> &queue) {
		vector<T> placeholder;
		auto queue_copy = std::priority_queue<T>(queue);
		while (queue_copy.size() > 0) {
			placeholder.emplace_back(queue_copy.top());
			queue_copy.pop();
		}
		WriteValue(placeholder);
	}